

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_session_init.c
# Opt level: O3

int is_right_ws_method(_Bool *meth,char *method)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = strcmp(method,"GET");
  bVar2 = iVar1 == 0;
  *meth = bVar2;
  return (bVar2 - 1) + (uint)bVar2;
}

Assistant:

int is_right_ws_method(bool *meth, char *method){
    if(strcmp(method, "GET") == 0){
        *meth = true;
        return 1;
    } else {
        *meth = false;
        return -1;
    }
}